

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Table> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
          (RefPtr<wabt::interp::Table> *__return_storage_ptr__,Store *this,Store *args,
          TableType *args_1)

{
  ExternKind EVar1;
  size_type __new_size;
  Table *pTVar2;
  Ref ref;
  Table *local_30;
  
  pTVar2 = (Table *)operator_new(0x88);
  EVar1 = (args_1->super_ExternType).kind;
  __new_size = (args_1->limits).initial;
  (pTVar2->super_Extern).super_Object.kind_ = Table;
  *(undefined8 *)&(pTVar2->super_Extern).super_Object.finalizer_.super__Function_base._M_functor = 0
  ;
  *(undefined8 *)
   ((long)&(pTVar2->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0;
  (pTVar2->super_Extern).super_Object.finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (pTVar2->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  (pTVar2->super_Extern).super_Object.host_info_ = (void *)0x0;
  (pTVar2->super_Extern).super_Object.self_.index = 0;
  (pTVar2->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Table_00183f60;
  (pTVar2->type_).super_ExternType.kind = EVar1;
  (pTVar2->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00184100;
  *(undefined8 *)&(pTVar2->type_).super_ExternType.field_0xc =
       *(undefined8 *)&(args_1->super_ExternType).field_0xc;
  *(undefined4 *)&(pTVar2->type_).field_0x14 = *(undefined4 *)&args_1->field_0x14;
  (pTVar2->type_).limits.initial = __new_size;
  (pTVar2->type_).limits.max = (args_1->limits).max;
  *(undefined4 *)((long)&(pTVar2->type_).limits.max + 7) =
       *(undefined4 *)((long)&(args_1->limits).max + 7);
  (pTVar2->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar2->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar2->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
            (&pTVar2->elements_,__new_size);
  local_30 = pTVar2;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Table*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_30);
  RefPtr<wabt::interp::Table>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}